

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O1

void ImGui::Image(Texture *texture,Color *tintColor,Color *borderColor)

{
  Vector2u VVar1;
  Vector2f local_20;
  
  VVar1 = sf::Texture::getSize(texture);
  local_20.x = (float)((ulong)VVar1 & 0xffffffff);
  local_20.y = (float)((ulong)VVar1 >> 0x20);
  Image(texture,&local_20,tintColor,borderColor);
  return;
}

Assistant:

void Image(const sf::Texture& texture, const sf::Color& tintColor, const sf::Color& borderColor) {
    Image(texture, static_cast<sf::Vector2f>(texture.getSize()), tintColor, borderColor);
}